

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     TersePrintPrefixToStrings<std::tuple<google::protobuf::internal::TcParseTable<0ul,10ul,0ul,0ul,8ul>*,int,int*>,3ul>
               (int **t,vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_2)

{
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  TersePrintPrefixToStrings<std::tuple<google::protobuf::internal::TcParseTable<0ul,10ul,0ul,0ul,8ul>*,int,int*>,2ul>
            ();
  std::__cxx11::stringstream::stringstream(local_198);
  PrintWithFallback<int*>(t,local_188);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(param_2,&bStack_1b8);
  std::__cxx11::string::~string((string *)&bStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void TersePrintPrefixToStrings(const Tuple& t,
                               std::integral_constant<size_t, I>,
                               Strings* strings) {
  TersePrintPrefixToStrings(t, std::integral_constant<size_t, I - 1>(),
                            strings);
  ::std::stringstream ss;
  UniversalTersePrint(std::get<I - 1>(t), &ss);
  strings->push_back(ss.str());
}